

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapIndexBuilder.cpp
# Opt level: O0

void __thiscall
BitmapIndexBuilder::add_file(BitmapIndexBuilder *this,FileId fid,uint8_t *data,size_t size)

{
  out_of_range *this_00;
  function<void_(unsigned_int)> *this_01;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  IndexBuilder *in_RDI;
  TrigramGenerator generator;
  anon_class_16_2_633b7b2e *__f;
  undefined8 in_stack_ffffffffffffff88;
  IndexType type;
  anon_class_16_2_633b7b2e local_58 [2];
  function<void_(unsigned_int)> *local_38;
  undefined8 local_20;
  undefined8 local_18;
  
  type = (IndexType)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (7 < in_ESI) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"fid");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  local_20 = in_RCX;
  local_18 = in_RDX;
  IndexBuilder::index_type(in_RDI);
  this_01 = (function<void_(unsigned_int)> *)get_generator_for(type);
  __f = local_58;
  local_38 = this_01;
  std::function<void(unsigned_int)>::
  function<BitmapIndexBuilder::add_file(unsigned_int,unsigned_char_const*,unsigned_long)::__0,void>
            (this_01,__f);
  (*(code *)this_01)(local_18,local_20,__f);
  std::function<void_(unsigned_int)>::~function((function<void_(unsigned_int)> *)0x20c4c7);
  return;
}

Assistant:

void BitmapIndexBuilder::add_file(FileId fid, const uint8_t *data,
                                  size_t size) {
    if (fid >= max_files) {
        // IndexBuilder's bitmap can't hold more than max_files files
        throw std::out_of_range("fid");
    }

    TrigramGenerator generator = get_generator_for(index_type());
    generator(data, size, [&](TriGram val) { add_trigram(fid, val); });
}